

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

obj * pick_obj(obj *otmp)

{
  char cVar1;
  boolean bVar2;
  obj *in_RAX;
  char *pcVar3;
  obj *poVar4;
  undefined1 uStack_28;
  char fakeshop [2];
  char saveushops [5];
  
  _uStack_28 = in_RAX;
  obj_extract_self(otmp);
  if (((u._1052_1_ & 1) == 0) && (uball != otmp)) {
    bVar2 = costly_spot(otmp->ox,otmp->oy);
    if (bVar2 != '\0') {
      strcpy(saveushops,u.ushops);
      pcVar3 = in_rooms(level,otmp->ox,otmp->oy,0x12);
      poVar4 = _uStack_28;
      cVar1 = *pcVar3;
      saveushops = SUB85(poVar4,3);
      _uStack_28 = CONCAT12(0,CONCAT11(cVar1,uStack_28));
      strcpy(u.ushops,fakeshop);
      addtobill(otmp,'\x01','\0','\0');
      strcpy(u.ushops,saveushops);
      pcVar3 = strchr(u.ushops,(int)cVar1);
      if (pcVar3 == (char *)0x0) {
        remote_burglary(otmp->ox,otmp->oy);
      }
    }
  }
  if ((*(uint *)&otmp->field_0x4a & 8) != 0) {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffff7;
  }
  newsym((int)otmp->ox,(int)otmp->oy);
  poVar4 = addinv(_uStack_28);
  return poVar4;
}

Assistant:

struct obj *pick_obj(struct obj *otmp)
{
	obj_extract_self(otmp);
	if (!u.uswallow && otmp != uball && costly_spot(otmp->ox, otmp->oy)) {
	    char saveushops[5], fakeshop[2];

	    /* addtobill cares about your location rather than the object's;
	       usually they'll be the same, but not when using telekinesis
	       (if ever implemented) or a grappling hook */
	    strcpy(saveushops, u.ushops);
	    fakeshop[0] = *in_rooms(level, otmp->ox, otmp->oy, SHOPBASE);
	    fakeshop[1] = '\0';
	    strcpy(u.ushops, fakeshop);
	    /* sets obj->unpaid if necessary */
	    addtobill(otmp, TRUE, FALSE, FALSE);
	    strcpy(u.ushops, saveushops);
	    /* if you're outside the shop, make shk notice */
	    if (!strchr(u.ushops, *fakeshop))
		remote_burglary(otmp->ox, otmp->oy);
	}
	if (otmp->no_charge)	/* only applies to objects outside invent */
	    otmp->no_charge = 0;
	newsym(otmp->ox, otmp->oy);
	return addinv(otmp);	/* might merge it with other objects */
}